

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txid.cpp
# Opt level: O2

void __thiscall Txid_IsValid_Test::TestBody(Txid_IsValid_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper AStack_a8;
  AssertHelper local_a0;
  AssertionResult gtest_ar__1;
  Txid empty_txid;
  Txid txid;
  AssertionResult gtest_ar_;
  ByteData256 bytes;
  
  std::__cxx11::string::string
            ((string *)&txid,"186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179",
             (allocator *)&empty_txid);
  cfd::core::ByteData256::ByteData256(&bytes,(string *)&txid);
  std::__cxx11::string::~string((string *)&txid);
  cfd::core::Txid::Txid(&txid,&bytes);
  gtest_ar_.success_ = cfd::core::Txid::IsValid(&txid);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&empty_txid,(internal *)&gtest_ar_,(AssertionResult *)0x4213f6,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_txid.cpp"
               ,0x4f,(char *)empty_txid._vptr_Txid);
    testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
    std::__cxx11::string::~string((string *)&empty_txid);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::Txid::Txid(&empty_txid);
  bVar1 = cfd::core::Txid::IsValid(&empty_txid);
  gtest_ar__1.success_ = !bVar1;
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&AStack_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"empty_txid.IsValid()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_txid.cpp"
               ,0x52,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&AStack_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  cfd::core::Txid::~Txid(&empty_txid);
  cfd::core::Txid::~Txid(&txid);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bytes);
  return;
}

Assistant:

TEST(Txid, IsValid) {
  ByteData256 bytes(
      "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  Txid txid(bytes);
  EXPECT_TRUE(txid.IsValid());

  Txid empty_txid;
  EXPECT_FALSE(empty_txid.IsValid());
}